

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<capnp::DynamicValue::Reader> * __thiscall
capnp::compiler::NodeTranslator::readConstant
          (Maybe<capnp::DynamicValue::Reader> *__return_storage_ptr__,NodeTranslator *this,
          Reader source,bool isBootstrap)

{
  Which WVar1;
  ErrorReporter *pEVar2;
  Resolver *pRVar3;
  SegmentReader *pSVar4;
  CapTableReader *pCVar5;
  void *pvVar6;
  WirePointer *pWVar7;
  Reader source_00;
  Field field;
  Reader name;
  undefined1 auVar8 [40];
  Reader name_00;
  ImplicitParams implicitMethodParams;
  undefined8 uVar9;
  undefined4 uVar10;
  ArrayPtr<const_char> AVar11;
  bool bVar12;
  Which WVar13;
  Type TVar14;
  uint32_t uVar15;
  NullableValue<capnp::compiler::BrandedDecl> *other;
  BrandedDecl *pBVar16;
  Which *pWVar17;
  uint64_t uVar18;
  NullableValue<capnp::Schema> *pNVar19;
  Schema *pSVar20;
  Schema *pSVar21;
  NullableValue<capnp::schema::Node::Reader> *other_00;
  Reader *pRVar22;
  Reader *__src;
  NullableValue<capnp::StructSchema::Field> *pNVar23;
  Field *pFVar24;
  char (*in_R8) [32];
  Type TVar25;
  ListSchema schema;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined8 uVar28;
  String local_a38;
  String local_a20;
  ArrayPtr<const_char> local_a08;
  Reader local_9f8;
  ArrayPtr<const_char> local_9c8;
  char *pcStack_9b8;
  StringPtr id_1;
  ArrayPtr<const_char> local_9a0;
  ArrayPtr<const_char> local_990;
  StringPtr local_980;
  undefined1 local_970 [8];
  StringPtr parent;
  Reader scopeReader;
  Schema *scope;
  CapTableReader *pCStack_920;
  void *local_918;
  WirePointer *pWStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  Maybe<capnp::Schema> local_8f8;
  undefined1 local_8e8 [8];
  NullableValue<capnp::Schema> _scope2361;
  Fault f;
  ReaderFor<capnp::DynamicList> local_8c0;
  Reader local_880;
  Schema local_838;
  ReaderFor<capnp::DynamicStruct> local_830;
  Reader local_7f8;
  Schema local_7b0;
  undefined1 local_7a8 [8];
  Type constType;
  Reader objValue;
  Maybe<capnp::StructSchema::Field> local_770;
  undefined1 local_728 [8];
  NullableValue<capnp::StructSchema::Field> _kj_result;
  undefined1 local_650 [8];
  Reader constValue;
  undefined1 local_5d8 [8];
  ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> dynamicConst;
  Reader constReader;
  Reader *finalProto;
  undefined1 local_528 [8];
  NullableValue<capnp::schema::Node::Reader> _finalProto2323;
  Reader proto;
  Schema *s;
  Maybe<capnp::Schema> local_480;
  undefined1 local_470 [8];
  NullableValue<capnp::Schema> _s2310;
  Schema constSchema;
  uint64_t id;
  Builder constBrand;
  MallocMessageBuilder builder;
  String local_2f8;
  String local_2e0;
  ArrayPtr<const_char> local_2c8;
  Which local_2b6;
  undefined1 local_2b4 [20];
  BrandedDecl *decl;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined4 local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined2 uStack_264;
  undefined1 uStack_262;
  undefined1 uStack_261;
  undefined8 local_260;
  undefined8 local_258;
  CapTableReader *pCStack_250;
  void *local_248;
  WirePointer *pWStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  Maybe<capnp::compiler::BrandedDecl> local_228;
  undefined1 local_178 [8];
  NullableValue<capnp::compiler::BrandedDecl> _decl2289;
  BrandedDecl constDecl;
  bool isBootstrap_local;
  NodeTranslator *this_local;
  
  BrandedDecl::BrandedDecl
            ((BrandedDecl *)&_decl2289.field_1.value.source._reader.nestingLimit,(void *)0x0);
  local_258 = source._reader.segment;
  pCStack_250 = source._reader.capTable;
  local_248 = source._reader.data;
  pWStack_240 = source._reader.pointers;
  local_238 = source._reader._32_8_;
  uStack_230 = source._reader._40_8_;
  ImplicitParams::none();
  source_00._reader.capTable._0_4_ = (int)pCStack_250;
  source_00._reader.segment = (SegmentReader *)local_258;
  source_00._reader.capTable._4_4_ = (int)((ulong)pCStack_250 >> 0x20);
  source_00._reader.data._0_4_ = (int)local_248;
  source_00._reader.data._4_4_ = (int)((ulong)local_248 >> 0x20);
  source_00._reader.pointers._0_4_ = (int)pWStack_240;
  source_00._reader.pointers._4_4_ = (int)((ulong)pWStack_240 >> 0x20);
  source_00._reader.dataSize = (StructDataBitCount)local_238;
  source_00._reader._36_4_ = SUB84(local_238,4);
  source_00._reader.nestingLimit = (int)uStack_230;
  source_00._reader._44_4_ = SUB84(uStack_230,4);
  implicitMethodParams.params.reader.segment = (SegmentReader *)uStack_288;
  implicitMethodParams.scopeId = local_290;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)local_280;
  implicitMethodParams.params.reader.ptr = (byte *)uStack_278;
  implicitMethodParams.params.reader.elementCount = local_270;
  implicitMethodParams.params.reader.step = uStack_26c;
  implicitMethodParams.params.reader.structDataSize = uStack_268;
  implicitMethodParams.params.reader.structPointerCount = uStack_264;
  implicitMethodParams.params.reader.elementSize = uStack_262;
  implicitMethodParams.params.reader._39_1_ = uStack_261;
  implicitMethodParams.params.reader._40_8_ = local_260;
  compileDeclExpression(&local_228,this,source_00,implicitMethodParams);
  other = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_228);
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_178,other);
  kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_228);
  pBVar16 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_178);
  if (pBVar16 == (BrandedDecl *)0x0) {
    kj::Maybe<capnp::DynamicValue::Reader>::Maybe(__return_storage_ptr__);
    uVar28 = local_290;
  }
  else {
    local_2b4._12_8_ =
         kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                   ((NullableValue<capnp::compiler::BrandedDecl> *)local_178);
    BrandedDecl::operator=
              ((BrandedDecl *)&_decl2289.field_1.value.source._reader.nestingLimit,
               (BrandedDecl *)local_2b4._12_8_);
    uVar28 = local_290;
  }
  local_2b4._5_3_ = 0;
  local_2b4[4] = pBVar16 == (BrandedDecl *)0x0;
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_178);
  if (local_2b4._4_4_ != 0) goto LAB_0022c33c;
  BrandedDecl::getKind((BrandedDecl *)local_2b4);
  local_2b6 = FILE;
  pWVar17 = kj::Maybe<capnp::compiler::Declaration::Which>::orDefault
                      ((Maybe<capnp::compiler::Declaration::Which> *)local_2b4,&local_2b6);
  WVar1 = *pWVar17;
  kj::Maybe<capnp::compiler::Declaration::Which>::~Maybe
            ((Maybe<capnp::compiler::Declaration::Which> *)local_2b4);
  if (WVar1 != CONST) {
    pEVar2 = this->errorReporter;
    auVar8 = source._reader._8_40_;
    name._reader._40_8_ = uVar28;
    name._reader.segment = (SegmentReader *)auVar8._0_8_;
    name._reader.capTable = (CapTableReader *)auVar8._8_8_;
    name._reader.data = (void *)auVar8._16_8_;
    name._reader.pointers = (WirePointer *)auVar8._24_8_;
    name._reader.dataSize = auVar8._32_4_;
    name._reader.pointerCount = auVar8._36_2_;
    name._reader._38_2_ = auVar8._38_2_;
    expressionString(name);
    kj::str<char_const(&)[2],kj::String,char_const(&)[32]>
              (&local_2e0,(kj *)0x3ac820,(char (*) [2])&local_2f8,
               (String *)"\' does not refer to a constant.",in_R8);
    kj::StringPtr::StringPtr((StringPtr *)&local_2c8,&local_2e0);
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
              (pEVar2,&source,(StringPtr)local_2c8);
    kj::String::~String(&local_2e0);
    kj::String::~String(&local_2f8);
    kj::Maybe<capnp::DynamicValue::Reader>::Maybe(__return_storage_ptr__);
    local_2b4._4_4_ = 1;
    goto LAB_0022c33c;
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&constBrand._builder.dataSize,0x100,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::schema::Brand>
            ((Builder *)&id,(MessageBuilder *)&constBrand._builder.dataSize);
  constSchema.raw = (RawBrandedSchema *)&id;
  uVar18 = BrandedDecl::
           getIdAndFillBrand<capnp::compiler::NodeTranslator::readConstant(capnp::compiler::Expression::Reader,bool)::__0>
                     ((BrandedDecl *)&_decl2289.field_1.value.source._reader.nestingLimit,
                      (Type *)&constSchema);
  Schema::Schema(&_s2310.field_1.value);
  pRVar3 = this->resolver;
  capnp::schema::Brand::Builder::operator_cast_to_Reader((Reader *)&s,(Builder *)&id);
  (*pRVar3->_vptr_Resolver[6])(&local_480,pRVar3,uVar18);
  pNVar19 = kj::_::readMaybe<capnp::Schema>(&local_480);
  kj::_::NullableValue<capnp::Schema>::NullableValue
            ((NullableValue<capnp::Schema> *)local_470,pNVar19);
  kj::Maybe<capnp::Schema>::~Maybe(&local_480);
  pSVar20 = kj::_::NullableValue::operator_cast_to_Schema_((NullableValue *)local_470);
  if (pSVar20 == (Schema *)0x0) {
    kj::Maybe<capnp::DynamicValue::Reader>::Maybe(__return_storage_ptr__);
  }
  else {
    pSVar21 = kj::_::NullableValue<capnp::Schema>::operator*
                        ((NullableValue<capnp::Schema> *)local_470);
    _s2310.field_1.value.raw = (Schema)pSVar21->raw;
  }
  local_2b4._5_3_ = 0;
  local_2b4[4] = pSVar20 == (Schema *)0x0;
  kj::_::NullableValue<capnp::Schema>::~NullableValue((NullableValue<capnp::Schema> *)local_470);
  if (local_2b4._4_4_ == 0) {
    Schema::getProto((Reader *)&_finalProto2323.field_1.value._reader.nestingLimit,
                     &_s2310.field_1.value);
    if (!isBootstrap) {
      (*this->resolver->_vptr_Resolver[7])(&finalProto,this->resolver,uVar18);
      other_00 = kj::_::readMaybe<capnp::schema::Node::Reader>
                           ((Maybe<capnp::schema::Node::Reader> *)&finalProto);
      kj::_::NullableValue<capnp::schema::Node::Reader>::NullableValue
                ((NullableValue<capnp::schema::Node::Reader> *)local_528,other_00);
      kj::Maybe<capnp::schema::Node::Reader>::~Maybe
                ((Maybe<capnp::schema::Node::Reader> *)&finalProto);
      pRVar22 = kj::_::NullableValue::operator_cast_to_Reader_((NullableValue *)local_528);
      if (pRVar22 == (Reader *)0x0) {
        kj::Maybe<capnp::DynamicValue::Reader>::Maybe(__return_storage_ptr__);
      }
      else {
        __src = kj::_::NullableValue<capnp::schema::Node::Reader>::operator*
                          ((NullableValue<capnp::schema::Node::Reader> *)local_528);
        memcpy((void *)((long)&_finalProto2323.field_1 + 0x28),__src,0x30);
      }
      local_2b4._5_3_ = 0;
      local_2b4[4] = pRVar22 == (Reader *)0x0;
      kj::_::NullableValue<capnp::schema::Node::Reader>::~NullableValue
                ((NullableValue<capnp::schema::Node::Reader> *)local_528);
      if (local_2b4._4_4_ != 0) goto LAB_0022c31c;
    }
    capnp::schema::Node::Reader::getConst
              ((Reader *)&dynamicConst.reader.nestingLimit,
               (Reader *)&_finalProto2323.field_1.value._reader.nestingLimit);
    capnp::schema::Node::Const::Reader::getValue
              ((Reader *)&constValue.field_1.listValue.reader.nestingLimit,
               (Reader *)&dynamicConst.reader.nestingLimit);
    toDynamic<capnp::schema::Value::Reader>
              ((ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> *)local_5d8,
               (Reader *)&constValue.field_1.listValue.reader.nestingLimit);
    DynamicStruct::Reader::which(&local_770,(Reader *)local_5d8);
    pNVar23 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_770);
    kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)local_728,pNVar23);
    kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_770);
    pFVar24 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_728);
    if (pFVar24 == (Field *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&objValue.reader.nestingLimit,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x91d,FAILED,"dynamicConst.which() != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&objValue.reader.nestingLimit);
    }
    pNVar23 = kj::mv<kj::_::NullableValue<capnp::StructSchema::Field>>
                        ((NullableValue<capnp::StructSchema::Field> *)local_728);
    kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)
               &_kj_result.field_1.value.proto._reader.nestingLimit,pNVar23);
    kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)local_728);
    pFVar24 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                        ((NullableValue<capnp::StructSchema::Field> *)
                         &_kj_result.field_1.value.proto._reader.nestingLimit);
    uVar9 = pFVar24->parent;
    uVar10 = pFVar24->index;
    field.index = uVar10;
    field.parent.super_Schema.raw = (Schema)(Schema)uVar9;
    pSVar4 = (pFVar24->proto)._reader.segment;
    pCVar5 = (pFVar24->proto)._reader.capTable;
    pvVar6 = (pFVar24->proto)._reader.data;
    pWVar7 = (pFVar24->proto)._reader.pointers;
    uVar28._0_4_ = (pFVar24->proto)._reader.dataSize;
    uVar28._4_2_ = (pFVar24->proto)._reader.pointerCount;
    uVar28._6_2_ = *(undefined2 *)&(pFVar24->proto)._reader.field_0x26;
    field._12_4_ = (int)((ulong)*(undefined8 *)&pFVar24->index >> 0x20);
    field.proto._reader.segment._0_4_ = (int)pSVar4;
    field.proto._reader.segment._4_4_ = (int)((ulong)pSVar4 >> 0x20);
    field.proto._reader.capTable._0_4_ = (int)pCVar5;
    field.proto._reader.capTable._4_4_ = (int)((ulong)pCVar5 >> 0x20);
    field.proto._reader.data._0_4_ = (int)pvVar6;
    field.proto._reader.data._4_4_ = (int)((ulong)pvVar6 >> 0x20);
    field.proto._reader.pointers._0_4_ = (int)pWVar7;
    field.proto._reader.pointers._4_4_ = (int)((ulong)pWVar7 >> 0x20);
    field.proto._reader.dataSize = (undefined4)uVar28;
    field.proto._reader.pointerCount = uVar28._4_2_;
    field.proto._reader._38_2_ = uVar28._6_2_;
    field.proto._reader.nestingLimit = (pFVar24->proto)._reader.nestingLimit;
    field.proto._reader._44_4_ = *(undefined4 *)&(pFVar24->proto)._reader.field_0x2c;
    DynamicStruct::Reader::get((Reader *)local_650,(Reader *)local_5d8,field);
    kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)
               &_kj_result.field_1.value.proto._reader.nestingLimit);
    TVar14 = DynamicValue::Reader::getType((Reader *)local_650);
    if (TVar14 == ANY_POINTER) {
      DynamicValue::Reader::as<capnp::AnyPointer>
                ((ReaderFor<capnp::AnyPointer> *)&constType.field_4,(Reader *)local_650);
      local_7b0.raw = (RawBrandedSchema *)Schema::asConst(&_s2310.field_1.value);
      TVar25 = ConstSchema::getType((ConstSchema *)&local_7b0);
      constType._0_8_ = TVar25.field_4;
      local_7a8 = TVar25._0_8_;
      WVar13 = capnp::Type::which((Type *)local_7a8);
      if (WVar13 == LIST) {
        schema = capnp::Type::asList((Type *)local_7a8);
        AnyPointer::Reader::getAs<capnp::DynamicList>
                  (&local_8c0,(Reader *)&constType.field_4,schema);
        DynamicValue::Reader::Reader(&local_880,&local_8c0);
        DynamicValue::Reader::operator=((Reader *)local_650,&local_880);
        DynamicValue::Reader::~Reader(&local_880);
      }
      else if (WVar13 == STRUCT) {
        local_838.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)local_7a8);
        AnyPointer::Reader::getAs<capnp::DynamicStruct>
                  (&local_830,(Reader *)&constType.field_4,(StructSchema)local_838.raw);
        DynamicValue::Reader::Reader(&local_7f8,&local_830);
        DynamicValue::Reader::operator=((Reader *)local_650,&local_7f8);
        DynamicValue::Reader::~Reader(&local_7f8);
      }
      else if (WVar13 != ANY_POINTER) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                  ((Fault *)&_scope2361.field_1.value,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x92f,FAILED,(char *)0x0,
                   "\"Unrecognized AnyPointer-typed member of schema::Value.\"",
                   (char (*) [55])"Unrecognized AnyPointer-typed member of schema::Value.");
        kj::_::Debug::Fault::fatal((Fault *)&_scope2361.field_1.value);
      }
    }
    bVar12 = Expression::Reader::isRelativeName(&source);
    if (bVar12) {
      pRVar3 = this->resolver;
      uVar18 = capnp::schema::Node::Reader::getScopeId
                         ((Reader *)&_finalProto2323.field_1.value._reader.nestingLimit);
      local_908._0_4_ = 0;
      local_908._4_2_ = 0;
      local_908._6_2_ = 0;
      uStack_900._0_4_ = 0;
      uStack_900._4_4_ = 0;
      local_918 = (void *)0x0;
      pWStack_910 = (WirePointer *)0x0;
      scope = (Schema *)0x0;
      pCStack_920 = (CapTableReader *)0x0;
      capnp::schema::Brand::Reader::Reader((Reader *)&scope);
      (*pRVar3->_vptr_Resolver[6])(&local_8f8,pRVar3,uVar18);
      pNVar19 = kj::_::readMaybe<capnp::Schema>(&local_8f8);
      kj::_::NullableValue<capnp::Schema>::NullableValue
                ((NullableValue<capnp::Schema> *)local_8e8,pNVar19);
      kj::Maybe<capnp::Schema>::~Maybe(&local_8f8);
      pSVar20 = kj::_::NullableValue::operator_cast_to_Schema_((NullableValue *)local_8e8);
      if (pSVar20 != (Schema *)0x0) {
        pSVar20 = kj::_::NullableValue<capnp::Schema>::operator*
                            ((NullableValue<capnp::Schema> *)local_8e8);
        Schema::getProto((Reader *)&parent.content.size_,pSVar20);
        kj::StringPtr::StringPtr((StringPtr *)local_970);
        bVar12 = capnp::schema::Node::Reader::isFile((Reader *)&parent.content.size_);
        if (bVar12) {
          kj::StringPtr::StringPtr(&local_980,"");
          AVar11.size_ = local_980.content.size_;
          AVar11.ptr = local_980.content.ptr;
        }
        else {
          local_9a0 = (ArrayPtr<const_char>)
                      capnp::schema::Node::Reader::getDisplayName((Reader *)&parent.content.size_);
          uVar15 = capnp::schema::Node::Reader::getDisplayNamePrefixLength
                             ((Reader *)&parent.content.size_);
          local_990 = (ArrayPtr<const_char>)
                      kj::StringPtr::slice((StringPtr *)&local_9a0,(ulong)uVar15);
          AVar11 = local_990;
        }
        parent.content.ptr = (char *)AVar11.size_;
        local_970 = (undefined1  [8])AVar11.ptr;
        Expression::Reader::getRelativeName(&local_9f8,&source);
        local_9c8 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_9f8);
        id_1.content.ptr = (char *)local_9c8.size_;
        pcStack_9b8 = local_9c8.ptr;
        pEVar2 = this->errorReporter;
        uVar26 = source._reader.data._0_4_;
        uVar27 = source._reader.data._4_4_;
        auVar8 = source._reader._8_40_;
        name_00._reader._40_8_ = uVar28;
        name_00._reader.segment = (SegmentReader *)auVar8._0_8_;
        name_00._reader.capTable = (CapTableReader *)auVar8._8_8_;
        name_00._reader.data = (void *)auVar8._16_8_;
        name_00._reader.pointers = (WirePointer *)auVar8._24_8_;
        name_00._reader.dataSize = auVar8._32_4_;
        name_00._reader.pointerCount = auVar8._36_2_;
        name_00._reader._38_2_ = auVar8._38_2_;
        expressionString(name_00);
        kj::
        str<char_const(&)[71],kj::String,char_const(&)[9],kj::StringPtr&,char_const(&)[2],kj::StringPtr&,char_const(&)[32]>
                  (&local_a20,
                   (kj *)"Constant names must be qualified to avoid confusion.  Please replace \'",
                   (char (*) [71])&local_a38,(String *)"\' with \'",(char (*) [9])local_970,
                   (StringPtr *)0x39b444,(char (*) [2])&pcStack_9b8,
                   (StringPtr *)"\', if that\'s what you intended.",
                   (char (*) [32])CONCAT44(uVar27,uVar26));
        kj::StringPtr::StringPtr((StringPtr *)&local_a08,&local_a20);
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  (pEVar2,&source,(StringPtr)local_a08);
        kj::String::~String(&local_a20);
        kj::String::~String(&local_a38);
      }
      kj::_::NullableValue<capnp::Schema>::~NullableValue((NullableValue<capnp::Schema> *)local_8e8)
      ;
    }
    kj::Maybe<capnp::DynamicValue::Reader>::Maybe(__return_storage_ptr__,(Reader *)local_650);
    local_2b4._4_4_ = 1;
    DynamicValue::Reader::~Reader((Reader *)local_650);
  }
LAB_0022c31c:
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&constBrand._builder.dataSize)
  ;
LAB_0022c33c:
  BrandedDecl::~BrandedDecl((BrandedDecl *)&_decl2289.field_1.value.source._reader.nestingLimit);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<DynamicValue::Reader> NodeTranslator::readConstant(
    Expression::Reader source, bool isBootstrap) {
  // Look up the constant decl.
  BrandedDecl constDecl = nullptr;
  KJ_IF_SOME(decl, compileDeclExpression(source, ImplicitParams::none())) {
    constDecl = decl;
  } else {
    // Lookup will have reported an error.
    return kj::none;
  }